

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O1

size_t getnum(char **fmt,size_t df)

{
  char *pcVar1;
  char *pcVar2;
  
  if (0xfffffff5 < (int)**fmt - 0x3aU) {
    df = 0;
    pcVar1 = *fmt;
    do {
      pcVar2 = pcVar1 + 1;
      *fmt = pcVar2;
      df = (ulong)((int)*pcVar1 - 0x30) + df * 10;
      if (9 < (int)*pcVar2 - 0x30U) {
        return df;
      }
      pcVar1 = pcVar2;
    } while (df < 0xccccccccccccccc);
  }
  return df;
}

Assistant:

static size_t getnum (const char **fmt, size_t df) {
  if (!digit(**fmt))  /* no number? */
    return df;  /* return default value */
  else {
    size_t a = 0;
    do {
      a = a*10 + cast_uint(*((*fmt)++) - '0');
    } while (digit(**fmt) && a <= (MAX_SIZE - 9)/10);
    return a;
  }
}